

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inflate_copy.cc
# Opt level: O0

void __thiscall inflate_copy_back_and_forth_Test::TestBody(inflate_copy_back_and_forth_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int err;
  zng_stream d2_stream;
  zng_stream d1_stream;
  zng_stream *in_stack_fffffffffffffd78;
  AssertHelper *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd88;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffd90;
  int32_t in_stack_fffffffffffffd94;
  undefined4 uVar2;
  zng_stream *in_stack_fffffffffffffd98;
  int line;
  char *in_stack_fffffffffffffda0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffdac;
  Type type;
  AssertHelper *in_stack_fffffffffffffdb0;
  Message *in_stack_fffffffffffffdf8;
  AssertionResult *this_03;
  AssertionResult local_1d8 [2];
  undefined4 local_1b4;
  AssertionResult local_1b0 [2];
  undefined4 local_18c;
  AssertionResult local_188 [2];
  undefined4 local_164;
  AssertionResult local_160 [2];
  undefined4 local_13c;
  AssertionResult local_138;
  uint local_124;
  undefined4 local_fc;
  AssertionResult local_f8;
  int32_t local_e4;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_18 = 0;
  local_e4 = zng_inflateInit2(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
  local_fc = 0;
  this_03 = &local_f8;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffd98,
             (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffdf8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x136652);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
    testing::Message::~Message((Message *)0x1366b5);
  }
  local_124 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136723);
  if (local_124 == 0) {
    local_e4 = zng_inflateCopy(in_stack_fffffffffffffd98,
                               (zng_stream *)
                               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    local_13c = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffd98,
               (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      testing::AssertionResult::failure_message((AssertionResult *)0x1367f2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
      testing::Message::~Message((Message *)0x13684f);
    }
    local_124 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1368bd);
    if (local_124 == 0) {
      local_e4 = zng_inflateEnd(in_stack_fffffffffffffd78);
      local_164 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffffd98,
                 (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
        testing::AssertionResult::failure_message((AssertionResult *)0x136984);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                   (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
        testing::Message::~Message((Message *)0x1369e1);
      }
      local_124 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x136a4f);
      if (local_124 == 0) {
        local_e4 = zng_inflateCopy(in_stack_fffffffffffffd98,
                                   (zng_stream *)
                                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        local_18c = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)in_stack_fffffffffffffd98,
                   (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
          in_stack_fffffffffffffdb0 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x136b1e);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                     (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
          testing::Message::~Message((Message *)0x136b7b);
        }
        local_124 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x136be9);
        if (local_124 == 0) {
          local_e4 = zng_inflateEnd(in_stack_fffffffffffffd78);
          local_1b4 = 0;
          this_02 = local_1b0;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((char *)in_stack_fffffffffffffd98,
                     (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
          type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
            in_stack_fffffffffffffd98 =
                 (zng_stream *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x136cb0);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdb0,type,&this_02->success_,
                       (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd80);
            testing::Message::~Message((Message *)0x136d0d);
          }
          local_124 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x136d7b);
          if (local_124 == 0) {
            local_e4 = zng_inflateEnd(in_stack_fffffffffffffd78);
            this_01 = local_1d8;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((char *)in_stack_fffffffffffffd98,
                       (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       (int *)this_01,(int *)in_stack_fffffffffffffd80);
            line = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
            uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd94);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
              this_00 = (AssertHelper *)
                        testing::AssertionResult::failure_message((AssertionResult *)0x136e42);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffdb0,type,&this_02->success_,line,
                         (char *)CONCAT44(uVar2,in_stack_fffffffffffffd90));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)this_03,in_stack_fffffffffffffdf8);
              testing::internal::AssertHelper::~AssertHelper(this_00);
              testing::Message::~Message((Message *)0x136e9f);
            }
            local_124 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x136f0a);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(inflate, copy_back_and_forth) {
    PREFIX3(stream) d1_stream, d2_stream;
    int err;

    memset(&d1_stream, 0, sizeof(d1_stream));
    err = PREFIX(inflateInit2)(&d1_stream, MAX_WBITS + 14);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateCopy)(&d2_stream, &d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateCopy)(&d1_stream, &d2_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d2_stream);
    ASSERT_EQ(err, Z_OK);
}